

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_GpuDevice.cpp
# Opt level: O3

void amrex::Gpu::Device::setStreamIndex(int idx)

{
  return;
}

Assistant:

void
Device::setStreamIndex (const int idx) noexcept
{
    amrex::ignore_unused(idx);
#ifdef AMREX_USE_GPU
    if (idx < 0) {
        gpu_stream[OpenMP::get_thread_num()] = gpu_default_stream;

#ifdef AMREX_USE_ACC
        amrex_set_acc_stream(acc_async_sync);
#endif
    } else {
        gpu_stream[OpenMP::get_thread_num()] = gpu_stream_pool[idx % max_gpu_streams];

#ifdef AMREX_USE_ACC
        amrex_set_acc_stream(idx % max_gpu_streams);
#endif
    }
#endif
}